

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intContain.c
# Opt level: O3

Aig_Man_t * Inter_ManFramesLatches(Aig_Man_t *pAig,int nFrames,Vec_Ptr_t **pvMapReg)

{
  void *pvVar1;
  uint uVar2;
  int iVar3;
  Aig_Man_t *p;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Aig_Obj_t *pAVar6;
  ulong uVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  long lVar9;
  int iVar10;
  int iVar11;
  
  if (pAig->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/int/intContain.c"
                  ,0x74,"Aig_Man_t *Inter_ManFramesLatches(Aig_Man_t *, int, Vec_Ptr_t **)");
  }
  p = Aig_ManStart((pAig->nObjs[6] + pAig->nObjs[5]) * nFrames);
  pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
  iVar10 = pAig->nRegs;
  iVar11 = (nFrames + 1) * iVar10;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  iVar3 = 8;
  if (6 < iVar11 - 1U) {
    iVar3 = iVar11;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar3;
  if (iVar3 == 0) {
    ppvVar5 = (void **)0x0;
  }
  else {
    ppvVar5 = (void **)malloc((long)iVar3 << 3);
  }
  pVVar4->pArray = ppvVar5;
  *pvMapReg = pVVar4;
  if (0 < iVar10) {
    iVar10 = 0;
    do {
      uVar2 = pAig->nTruePis + iVar10;
      if (((int)uVar2 < 0) || (pAig->vCis->nSize <= (int)uVar2)) {
LAB_00904b5b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar1 = pAig->vCis->pArray[uVar2];
      pAVar6 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar6;
      pVVar4 = *pvMapReg;
      uVar2 = pVVar4->nSize;
      if (uVar2 == pVVar4->nCap) {
        if ((int)uVar2 < 0x10) {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = 0x10;
        }
        else {
          if (pVVar4->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
          }
          pVVar4->pArray = ppvVar5;
          pVVar4->nCap = uVar2 * 2;
        }
      }
      else {
        ppvVar5 = pVVar4->pArray;
      }
      iVar3 = pVVar4->nSize;
      pVVar4->nSize = iVar3 + 1;
      ppvVar5[iVar3] = pAVar6;
      iVar10 = iVar10 + 1;
    } while (iVar10 < pAig->nRegs);
  }
  if (0 < nFrames) {
    iVar10 = 0;
    do {
      if (0 < pAig->nTruePis) {
        lVar9 = 0;
        do {
          if (pAig->vCis->nSize <= lVar9) goto LAB_00904b5b;
          pvVar1 = pAig->vCis->pArray[lVar9];
          pAVar6 = Aig_ObjCreateCi(p);
          *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar6;
          lVar9 = lVar9 + 1;
        } while (lVar9 < pAig->nTruePis);
      }
      pVVar4 = pAig->vObjs;
      if (0 < pVVar4->nSize) {
        lVar9 = 0;
        do {
          pvVar1 = pVVar4->pArray[lVar9];
          if ((pvVar1 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar1 + 0x18) & 7) - 7)) {
            if (((ulong)pvVar1 & 1) != 0) goto LAB_00904b7a;
            uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              pAVar6 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar6 = (Aig_Obj_t *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            uVar7 = *(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe;
            if (uVar7 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^ *(ulong *)(uVar7 + 0x28));
            }
            pAVar6 = Aig_And(p,pAVar6,p1);
            *(Aig_Obj_t **)((long)pvVar1 + 0x28) = pAVar6;
            pVVar4 = pAig->vObjs;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar4->nSize);
      }
      if (0 < pAig->nRegs) {
        iVar3 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar3;
          if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) goto LAB_00904b5b;
          pvVar1 = pAig->vCos->pArray[uVar2];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_00904b7a:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar7 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^ *(ulong *)(uVar7 + 0x28);
          }
          *(ulong *)((long)pvVar1 + 0x28) = uVar7;
          iVar3 = iVar3 + 1;
        } while (iVar3 < pAig->nRegs);
        if (0 < pAig->nRegs) {
          iVar3 = 0;
          do {
            uVar2 = pAig->nTruePos + iVar3;
            if (((((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) ||
                (uVar8 = pAig->nTruePis + iVar3, (int)uVar8 < 0)) ||
               (pAig->vCis->nSize <= (int)uVar8)) goto LAB_00904b5b;
            pvVar1 = *(void **)((long)pAig->vCos->pArray[uVar2] + 0x28);
            *(void **)((long)pAig->vCis->pArray[uVar8] + 0x28) = pvVar1;
            pVVar4 = *pvMapReg;
            uVar2 = pVVar4->nSize;
            if (uVar2 == pVVar4->nCap) {
              if ((int)uVar2 < 0x10) {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc(0x80);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = 0x10;
              }
              else {
                if (pVVar4->pArray == (void **)0x0) {
                  ppvVar5 = (void **)malloc((ulong)uVar2 << 4);
                }
                else {
                  ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar2 << 4);
                }
                pVVar4->pArray = ppvVar5;
                pVVar4->nCap = uVar2 * 2;
              }
            }
            else {
              ppvVar5 = pVVar4->pArray;
            }
            iVar11 = pVVar4->nSize;
            pVVar4->nSize = iVar11 + 1;
            ppvVar5[iVar11] = pvVar1;
            iVar3 = iVar3 + 1;
          } while (iVar3 < pAig->nRegs);
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != nFrames);
  }
  return p;
}

Assistant:

Aig_Man_t * Inter_ManFramesLatches( Aig_Man_t * pAig, int nFrames, Vec_Ptr_t ** pvMapReg )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, f;
    assert( Saig_ManRegNum(pAig) > 0 );
    pFrames = Aig_ManStart( Aig_ManNodeNum(pAig) * nFrames );
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pFrames );
    // create variables for register outputs
    *pvMapReg = Vec_PtrAlloc( (nFrames+1) * Saig_ManRegNum(pAig) );
    Saig_ManForEachLo( pAig, pObj, i )
    {
        pObj->pData = Aig_ObjCreateCi( pFrames );
        Vec_PtrPush( *pvMapReg, pObj->pData );
    }
    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // create PI nodes for this frame
        Saig_ManForEachPi( pAig, pObj, i )
            pObj->pData = Aig_ObjCreateCi( pFrames );
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
            pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
        // save register inputs
        Saig_ManForEachLi( pAig, pObj, i )
            pObj->pData = Aig_ObjChild0Copy(pObj);
        // transfer to register outputs
        Saig_ManForEachLiLo(  pAig, pObjLi, pObjLo, i )
        {
            pObjLo->pData = pObjLi->pData;
            Vec_PtrPush( *pvMapReg, pObjLo->pData );
        }
    }
    return pFrames;
}